

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool aedit_climate(CHAR_DATA *ch,char *argument)

{
  v9 *pvVar1;
  long in_RDI;
  int climate;
  int icli;
  char hold [4608];
  char wcli [4608];
  string buffer;
  AREA_DATA_conflict *pArea;
  char *in_stack_ffffffffffffd958;
  char *in_stack_ffffffffffffd960;
  CHAR_DATA *in_stack_ffffffffffffd968;
  CHAR_DATA *in_stack_ffffffffffffd970;
  char *local_2650;
  CHAR_DATA *local_2648;
  string local_2640 [32];
  CHAR_DATA *local_2620 [2];
  string local_2610 [48];
  int local_25e0;
  int local_25dc;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  local_25d8 [25];
  format_args in_stack_ffffffffffffdbc0;
  string_view in_stack_ffffffffffffdbd0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  local_13d8 [288];
  string local_1d8 [32];
  long local_1b8;
  long local_1a8;
  byte local_199;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_198 [2];
  undefined8 local_188;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_180;
  char *local_178;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_168;
  char *local_160;
  CHAR_DATA *pCStack_158;
  string *local_150;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_148 [3];
  undefined8 local_130;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_128;
  CHAR_DATA *local_120;
  size_t local_118;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_110;
  CHAR_DATA *local_108;
  size_t sStack_100;
  string *local_f8;
  char *local_f0;
  CHAR_DATA **local_e8;
  char *local_e0;
  char **local_d8;
  char *local_d0;
  char **local_c8;
  char *local_c0;
  CHAR_DATA **local_b8;
  CHAR_DATA **local_b0;
  CHAR_DATA *local_a8;
  size_t sStack_a0;
  char **local_90;
  char *local_88;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_70;
  undefined8 *local_68;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_60;
  undefined8 local_58;
  undefined8 *local_50;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_48;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_40;
  undefined8 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_30;
  undefined8 local_28;
  undefined8 *local_20;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_18;
  char *local_10;
  char *local_8;
  
  local_1a8 = in_RDI;
  std::__cxx11::string::string(local_1d8);
  local_25dc = 0;
  local_1b8 = *(long *)(*(long *)(local_1a8 + 0x80) + 0x6c60);
  pvVar1 = (v9 *)local_13d8;
  one_argument(in_stack_ffffffffffffd960,in_stack_ffffffffffffd958);
  local_25dc = aclimate_lookup((char *)in_stack_ffffffffffffd968);
  if (local_25dc < 0) {
    local_e8 = local_2620;
    local_f0 = "{} is not a valid climate.\n\r";
    local_c0 = "{} is not a valid climate.\n\r";
    local_2620[0] = (CHAR_DATA *)0x82d453;
    local_b8 = local_e8;
    local_118 = std::char_traits<char>::length((char_type *)0x77cd38);
    local_10 = local_f0;
    local_f8 = local_2610;
    local_108 = local_2620[0];
    local_110 = local_13d8;
    local_b0 = &local_108;
    local_120 = local_2620[0];
    sStack_100 = local_118;
    local_a8 = local_120;
    sStack_a0 = local_118;
    local_148[0] = fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                             (local_110,pvVar1,(char (*) [4608])local_f8);
    local_68 = &local_130;
    local_70 = local_148;
    local_58 = 0xc;
    local_130 = 0xc;
    local_60 = local_70;
    local_50 = local_68;
    local_48 = local_70;
    local_128 = local_70;
    fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc0);
    std::__cxx11::string::operator=(local_1d8,local_2610);
    std::__cxx11::string::~string(local_2610);
    std::__cxx11::string::c_str();
    send_to_char((char *)in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
    send_to_char((char *)in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
    local_25e0 = 0;
    while ((local_25e0 < 9 && (climate_table[local_25e0].name != (char *)0x0))) {
      pvVar1 = (v9 *)0x830711;
      sprintf((char *)local_25d8,"%s ",climate_table[local_25e0].name);
      if (local_25e0 % 3 == 0) {
        local_d8 = &local_2650;
        local_e0 = "{}\n\r";
        local_d0 = "{}\n\r";
        local_2650 = "{}\n\r";
        in_stack_ffffffffffffd968 = (CHAR_DATA *)&local_2648;
        local_c8 = local_d8;
        in_stack_ffffffffffffd970 =
             (CHAR_DATA *)std::char_traits<char>::length((char_type *)0x77d025);
        in_stack_ffffffffffffd968->next = in_stack_ffffffffffffd970;
        local_8 = local_e0;
        local_150 = local_2640;
        local_160 = local_2650;
        pCStack_158 = local_2648;
        local_168 = local_25d8;
        local_90 = &local_160;
        local_178 = local_2650;
        local_88 = local_178;
        local_198[0] = fmt::v9::
                       make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                                 (local_168,pvVar1,(char (*) [4608])local_150);
        local_38 = &local_188;
        local_40 = local_198;
        local_28 = 0xc;
        local_188 = 0xc;
        local_30 = local_40;
        local_20 = local_38;
        local_18 = local_40;
        local_180 = local_40;
        fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc0);
        std::__cxx11::string::operator=(local_1d8,local_2640);
        std::__cxx11::string::~string(local_2640);
      }
      std::__cxx11::string::c_str();
      send_to_char((char *)in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
      local_25e0 = local_25e0 + 1;
    }
    if (local_25e0 % 3 != 0) {
      send_to_char((char *)in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
    }
    local_199 = 0;
  }
  else {
    *(undefined2 *)(local_1b8 + 0x158) = (undefined2)local_25dc;
    send_to_char((char *)in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
    local_199 = 1;
  }
  std::__cxx11::string::~string(local_1d8);
  return (bool)(local_199 & 1);
}

Assistant:

bool aedit_climate(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	std::string buffer;
	char wcli[MSL];
	char hold[MSL];
	int icli = 0, climate;

	EDIT_AREA(ch, pArea);

	one_argument(argument, wcli);

	icli = aclimate_lookup(wcli);

	if (icli < 0)
	{
		buffer = fmt::format("{} is not a valid climate.\n\r", wcli);
		send_to_char(buffer.c_str(), ch);
		send_to_char("The following climates are available:\n\r", ch);

		for (climate = 0; climate < Climate::MaxClimate; climate++)
		{
			if (climate_table[climate].name == nullptr)
				break;

			sprintf(hold, "%s ", climate_table[climate].name);

			if (climate % 3 == 0)
				buffer = fmt::format("{}\n\r", hold);

			send_to_char(buffer.c_str(), ch);
		}

		if (climate % 3 != 0)
			send_to_char("\n\r", ch);

		return false;
	}
	else
	{
		pArea->climate = icli;
		send_to_char("Climate set.\n\r", ch);
		return true;
	}
}